

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

recursive_directory_iterator * __thiscall
ghc::filesystem::recursive_directory_iterator::increment
          (recursive_directory_iterator *this,error_code *ec)

{
  element_type *peVar1;
  _Map_pointer ppdVar2;
  bool bVar3;
  _Elt_pointer pdVar4;
  int iVar5;
  file_status symlink_status;
  file_status status;
  directory_iterator local_50;
  undefined1 local_40 [16];
  
  peVar1 = (this->_impl).
           super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pdVar4 = ((iterator *)
           ((long)&(peVar1->_dir_iter_stack).c.
                   super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                   ._M_impl + 0x30))->_M_cur;
  if (pdVar4 == *(_Elt_pointer *)
                 ((long)&(peVar1->_dir_iter_stack).c.
                         super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                         ._M_impl + 0x38)) {
    pdVar4 = (*(_Map_pointer *)
               ((long)&(peVar1->_dir_iter_stack).c.
                       super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                       ._M_impl + 0x48))[-1] + 0x20;
  }
  directory_entry::status
            ((directory_entry *)(local_40 + 8),
             (error_code *)
             &(pdVar4[-1]._impl.
               super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_dir_entry);
  if (ec->_M_value == 0) {
    peVar1 = (this->_impl).
             super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pdVar4 = ((iterator *)
             ((long)&(peVar1->_dir_iter_stack).c.
                     super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                     ._M_impl + 0x30))->_M_cur;
    if (pdVar4 == *(_Elt_pointer *)
                   ((long)&(peVar1->_dir_iter_stack).c.
                           super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                           ._M_impl + 0x38)) {
      pdVar4 = (*(_Map_pointer *)
                 ((long)&(peVar1->_dir_iter_stack).c.
                         super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                         ._M_impl + 0x48))[-1] + 0x20;
    }
    directory_entry::symlink_status
              ((directory_entry *)local_40,
               (error_code *)
               &(pdVar4[-1]._impl.
                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_dir_entry);
    if (ec->_M_value == 0) {
      peVar1 = (this->_impl).
               super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((peVar1->_recursion_pending == true) && (local_40._8_4_ == 3)) &&
         ((local_40._0_4_ != 4 || ((peVar1->_options & follow_directory_symlink) != none)))) {
        pdVar4 = ((iterator *)
                 ((long)&(peVar1->_dir_iter_stack).c.
                         super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                         ._M_impl + 0x30))->_M_cur;
        if (pdVar4 == *(_Elt_pointer *)
                       ((long)&(peVar1->_dir_iter_stack).c.
                               super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                               ._M_impl + 0x38)) {
          pdVar4 = (*(_Map_pointer *)
                     ((long)&(peVar1->_dir_iter_stack).c.
                             super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                             ._M_impl + 0x48))[-1] + 0x20;
        }
        directory_iterator::directory_iterator
                  (&local_50,
                   &((pdVar4[-1]._impl.
                      super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_dir_entry)._path,peVar1->_options,ec);
        std::
        deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
        ::emplace_back<ghc::filesystem::directory_iterator>(&(peVar1->_dir_iter_stack).c,&local_50);
        if (local_50._impl.
            super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50._impl.
                     super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      else {
        pdVar4 = ((iterator *)
                 ((long)&(peVar1->_dir_iter_stack).c.
                         super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                         ._M_impl + 0x30))->_M_cur;
        if (pdVar4 == *(_Elt_pointer *)
                       ((long)&(peVar1->_dir_iter_stack).c.
                               super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                               ._M_impl + 0x38)) {
          pdVar4 = (*(_Map_pointer *)
                     ((long)&(peVar1->_dir_iter_stack).c.
                             super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                             ._M_impl + 0x48))[-1] + 0x20;
        }
        directory_iterator::impl::increment
                  (pdVar4[-1]._impl.
                   super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,ec);
      }
      if (ec->_M_value == 0) {
        while( true ) {
          peVar1 = (this->_impl).
                   super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          ppdVar2 = *(_Map_pointer *)
                     ((long)&(peVar1->_dir_iter_stack).c.
                             super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                             ._M_impl + 0x48);
          iVar5 = (int)((ulong)((long)*(_Elt_pointer *)
                                       ((long)&(peVar1->_dir_iter_stack).c.
                                               super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                               ._M_impl + 0x20) -
                               (long)((iterator *)
                                     ((long)&(peVar1->_dir_iter_stack).c.
                                             super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                             ._M_impl + 0x10))->_M_cur) >> 4) +
                  (int)((ulong)((long)((iterator *)
                                      ((long)&(peVar1->_dir_iter_stack).c.
                                              super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                              ._M_impl + 0x30))->_M_cur -
                               (long)*(_Elt_pointer *)
                                      ((long)&(peVar1->_dir_iter_stack).c.
                                              super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                              ._M_impl + 0x38)) >> 4) +
                  ((((uint)((int)ppdVar2 -
                           *(int *)((long)&(peVar1->_dir_iter_stack).c.
                                           super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                           ._M_impl + 0x28)) >> 3) - 1) +
                  (uint)(ppdVar2 == (_Map_pointer)0x0)) * 0x20;
          if (iVar5 == 1) {
            bVar3 = false;
          }
          else {
            pdVar4 = ((iterator *)
                     ((long)&(peVar1->_dir_iter_stack).c.
                             super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                             ._M_impl + 0x30))->_M_cur;
            if (pdVar4 == *(_Elt_pointer *)
                           ((long)&(peVar1->_dir_iter_stack).c.
                                   super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                   ._M_impl + 0x38)) {
              pdVar4 = (*(_Map_pointer *)
                         ((long)&(peVar1->_dir_iter_stack).c.
                                 super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                 ._M_impl + 0x48))[-1] + 0x20;
            }
            directory_iterator::directory_iterator(&local_50);
            bVar3 = filesystem::operator==
                              (&(pdVar4[-1]._impl.
                                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_current,
                               &(local_50._impl.
                                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_current);
          }
          if ((iVar5 != 1) &&
             (local_50._impl.
              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50._impl.
                       super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (bVar3 == false) break;
          std::
          deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
          ::pop_back(&(((this->_impl).
                        super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_dir_iter_stack).c);
          peVar1 = (this->_impl).
                   super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          pdVar4 = ((iterator *)
                   ((long)&(peVar1->_dir_iter_stack).c.
                           super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                           ._M_impl + 0x30))->_M_cur;
          if (pdVar4 == *(_Elt_pointer *)
                         ((long)&(peVar1->_dir_iter_stack).c.
                                 super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                 ._M_impl + 0x38)) {
            pdVar4 = (*(_Map_pointer *)
                       ((long)&(peVar1->_dir_iter_stack).c.
                               super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                               ._M_impl + 0x48))[-1] + 0x20;
          }
          directory_iterator::impl::increment
                    (pdVar4[-1]._impl.
                     super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,ec);
        }
      }
      else {
        peVar1 = (this->_impl).
                 super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (((iterator *)
            ((long)&(peVar1->_dir_iter_stack).c.
                    super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                    ._M_impl + 0x30))->_M_cur !=
            ((iterator *)
            ((long)&(peVar1->_dir_iter_stack).c.
                    super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                    ._M_impl + 0x10))->_M_cur) {
          std::
          deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
          ::pop_back(&(peVar1->_dir_iter_stack).c);
        }
      }
      ((this->_impl).
       super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_recursion_pending = true;
    }
  }
  return this;
}

Assistant:

GHC_INLINE recursive_directory_iterator& recursive_directory_iterator::increment(std::error_code& ec) noexcept
{
    auto status = (*this)->status(ec);
    if (ec) return *this;
    auto symlink_status = (*this)->symlink_status(ec);
    if (ec) return *this;
    if (recursion_pending() && is_directory(status) && (!is_symlink(symlink_status) || (options() & directory_options::follow_directory_symlink) != directory_options::none)) {
        _impl->_dir_iter_stack.push(directory_iterator((*this)->path(), _impl->_options, ec));
    }
    else {
        _impl->_dir_iter_stack.top().increment(ec);
    }
    if (!ec) {
        while (depth() && _impl->_dir_iter_stack.top() == directory_iterator()) {
            _impl->_dir_iter_stack.pop();
            _impl->_dir_iter_stack.top().increment(ec);
        }
    }
    else if (!_impl->_dir_iter_stack.empty()) {
        _impl->_dir_iter_stack.pop();
    }
    _impl->_recursion_pending = true;
    return *this;
}